

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

void CVmObjList::add_to_list(vm_val_t *result,vm_obj_id_t self,char *lstval,vm_val_t *rhs)

{
  CVmObjPageEntry *pCVar1;
  ushort *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_8_8_cb74652f_for_val aVar24;
  vm_datatype_t *pvVar25;
  undefined4 uVar26;
  vm_val_t *pvVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  vm_obj_id_t vVar36;
  uint uVar37;
  undefined1 *puVar38;
  long lVar39;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar67;
  int iVar68;
  undefined1 auVar65 [16];
  int iVar69;
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vm_val_t val;
  vm_val_t local_50;
  vm_val_t local_40;
  ulong uVar40;
  
  pvVar27 = sp_;
  pvVar25 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar25 = VM_OBJ;
  (pvVar27->val).obj = self;
  pvVar27 = sp_;
  uVar26 = *(undefined4 *)&rhs->field_0x4;
  aVar24 = rhs->val;
  sp_ = sp_ + 1;
  pvVar27->typ = rhs->typ;
  *(undefined4 *)&pvVar27->field_0x4 = uVar26;
  pvVar27->val = aVar24;
  uVar42 = (ulong)*(ushort *)lstval;
  iVar35 = vm_val_t::is_listlike(rhs);
  if (iVar35 == 0) {
    iVar35 = -1;
  }
  else {
    iVar35 = vm_val_t::ll_length(rhs);
  }
  iVar64 = 1;
  if (-1 < iVar35) {
    iVar64 = iVar35;
  }
  vVar36 = create(0,(long)iVar64 + uVar42 & 0xffffffff);
  pCVar1 = G_obj_table_X.pages_[vVar36 >> 0xc];
  uVar37 = vVar36 & 0xfff;
  memcpy((void *)(*(long *)((long)&pCVar1[uVar37].ptr_ + 8) + 2),lstval + 2,
         (ulong)*(ushort *)lstval * 5);
  auVar34 = _DAT_002fd350;
  auVar33 = _DAT_002fd340;
  auVar32 = _DAT_002c63f0;
  auVar31 = _DAT_002c63e0;
  auVar30 = _DAT_002c4b80;
  auVar29 = _DAT_002c4b70;
  auVar28 = _DAT_002c4b60;
  puVar2 = *(ushort **)((long)&pCVar1[uVar37].ptr_ + 8);
  if (iVar35 < 0) {
    vmb_put_dh((char *)((long)puVar2 + uVar42 * 5 + 2),rhs);
  }
  else {
    uVar41 = (ulong)*puVar2;
    if (uVar41 != 0) {
      uVar43 = ((long)iVar64 + uVar42) - 1;
      uVar40 = uVar41 - 1;
      if (uVar43 < uVar41) {
        uVar40 = uVar43;
      }
      lVar39 = uVar40 - uVar42;
      if (uVar42 <= uVar40) {
        auVar44._8_4_ = (int)lVar39;
        auVar44._0_8_ = lVar39;
        auVar44._12_4_ = (int)((ulong)lVar39 >> 0x20);
        puVar38 = (undefined1 *)((long)puVar2 + uVar42 * 5 + 0x4d);
        uVar41 = 0;
        do {
          auVar62._8_4_ = (int)uVar41;
          auVar62._0_8_ = uVar41;
          auVar62._12_4_ = (int)(uVar41 >> 0x20);
          auVar65 = auVar44 ^ auVar30;
          auVar70 = (auVar62 | auVar29) ^ auVar30;
          iVar64 = auVar65._0_4_;
          iVar83 = -(uint)(iVar64 < auVar70._0_4_);
          iVar67 = auVar65._4_4_;
          auVar72._4_4_ = -(uint)(iVar67 < auVar70._4_4_);
          iVar68 = auVar65._8_4_;
          iVar87 = -(uint)(iVar68 < auVar70._8_4_);
          iVar69 = auVar65._12_4_;
          auVar72._12_4_ = -(uint)(iVar69 < auVar70._12_4_);
          auVar45._4_4_ = iVar83;
          auVar45._0_4_ = iVar83;
          auVar45._8_4_ = iVar87;
          auVar45._12_4_ = iVar87;
          auVar45 = pshuflw(in_XMM1,auVar45,0xe8);
          auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar67);
          auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar69);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar54 = pshuflw(in_XMM2,auVar71,0xe8);
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar70 = pshuflw(auVar45,auVar72,0xe8);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar65 = (auVar70 | auVar54 & auVar45) ^ auVar65;
          auVar65 = packssdw(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar38[-0x4b] = 1;
          }
          auVar54._4_4_ = iVar83;
          auVar54._0_4_ = iVar83;
          auVar54._8_4_ = iVar87;
          auVar54._12_4_ = iVar87;
          auVar72 = auVar71 & auVar54 | auVar72;
          auVar65 = packssdw(auVar72,auVar72);
          auVar70._8_4_ = 0xffffffff;
          auVar70._0_8_ = 0xffffffffffffffff;
          auVar70._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar70,auVar65 ^ auVar70);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 8 & 1) != 0) {
            puVar38[-0x46] = 1;
          }
          auVar65 = (auVar62 | auVar28) ^ auVar30;
          auVar55._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar55._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar55._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar55._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar73._4_4_ = auVar55._0_4_;
          auVar73._0_4_ = auVar55._0_4_;
          auVar73._8_4_ = auVar55._8_4_;
          auVar73._12_4_ = auVar55._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar12._4_4_ = iVar83;
          auVar12._0_4_ = iVar83;
          auVar12._8_4_ = iVar87;
          auVar12._12_4_ = iVar87;
          auVar84._4_4_ = auVar55._4_4_;
          auVar84._0_4_ = auVar55._4_4_;
          auVar84._8_4_ = auVar55._12_4_;
          auVar84._12_4_ = auVar55._12_4_;
          auVar65 = auVar12 & auVar73 | auVar84;
          auVar65 = packssdw(auVar65,auVar65);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar3,auVar65 ^ auVar3);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 0x10 & 1) != 0) {
            puVar38[-0x41] = 1;
          }
          auVar65 = pshufhw(auVar65,auVar73,0x84);
          auVar13._4_4_ = iVar83;
          auVar13._0_4_ = iVar83;
          auVar13._8_4_ = iVar87;
          auVar13._12_4_ = iVar87;
          auVar70 = pshufhw(auVar55,auVar13,0x84);
          auVar45 = pshufhw(auVar65,auVar84,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar45 | auVar70 & auVar65) ^ auVar46;
          auVar65 = packssdw(auVar46,auVar46);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 0x18 & 1) != 0) {
            puVar38[-0x3c] = 1;
          }
          auVar65 = (auVar62 | auVar32) ^ auVar30;
          auVar56._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar56._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar56._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar56._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar14._4_4_ = auVar56._0_4_;
          auVar14._0_4_ = auVar56._0_4_;
          auVar14._8_4_ = auVar56._8_4_;
          auVar14._12_4_ = auVar56._8_4_;
          auVar70 = pshuflw(auVar84,auVar14,0xe8);
          auVar47._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar47._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar47._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar47._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar74._4_4_ = auVar47._4_4_;
          auVar74._0_4_ = auVar47._4_4_;
          auVar74._8_4_ = auVar47._12_4_;
          auVar74._12_4_ = auVar47._12_4_;
          auVar65 = pshuflw(auVar47,auVar74,0xe8);
          auVar75._4_4_ = auVar56._4_4_;
          auVar75._0_4_ = auVar56._4_4_;
          auVar75._8_4_ = auVar56._12_4_;
          auVar75._12_4_ = auVar56._12_4_;
          auVar45 = pshuflw(auVar56,auVar75,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 & auVar70,(auVar45 | auVar65 & auVar70) ^ auVar4);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar38[-0x37] = 1;
          }
          auVar15._4_4_ = auVar56._0_4_;
          auVar15._0_4_ = auVar56._0_4_;
          auVar15._8_4_ = auVar56._8_4_;
          auVar15._12_4_ = auVar56._8_4_;
          auVar75 = auVar74 & auVar15 | auVar75;
          auVar45 = packssdw(auVar75,auVar75);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65,auVar45 ^ auVar5);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._4_2_ >> 8 & 1) != 0) {
            puVar38[-0x32] = 1;
          }
          auVar65 = (auVar62 | auVar31) ^ auVar30;
          auVar57._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar57._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar57._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar57._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar76._4_4_ = auVar57._0_4_;
          auVar76._0_4_ = auVar57._0_4_;
          auVar76._8_4_ = auVar57._8_4_;
          auVar76._12_4_ = auVar57._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar16._4_4_ = iVar83;
          auVar16._0_4_ = iVar83;
          auVar16._8_4_ = iVar87;
          auVar16._12_4_ = iVar87;
          auVar85._4_4_ = auVar57._4_4_;
          auVar85._0_4_ = auVar57._4_4_;
          auVar85._8_4_ = auVar57._12_4_;
          auVar85._12_4_ = auVar57._12_4_;
          auVar65 = auVar16 & auVar76 | auVar85;
          auVar65 = packssdw(auVar65,auVar65);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar6,auVar65 ^ auVar6);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar38[-0x2d] = 1;
          }
          auVar65 = pshufhw(auVar65,auVar76,0x84);
          auVar17._4_4_ = iVar83;
          auVar17._0_4_ = iVar83;
          auVar17._8_4_ = iVar87;
          auVar17._12_4_ = iVar87;
          auVar70 = pshufhw(auVar57,auVar17,0x84);
          auVar45 = pshufhw(auVar65,auVar85,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar45 | auVar70 & auVar65) ^ auVar48;
          auVar65 = packssdw(auVar48,auVar48);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._6_2_ >> 8 & 1) != 0) {
            puVar38[-0x28] = 1;
          }
          auVar65 = (auVar62 | auVar34) ^ auVar30;
          auVar58._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar58._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar58._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar58._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar18._4_4_ = auVar58._0_4_;
          auVar18._0_4_ = auVar58._0_4_;
          auVar18._8_4_ = auVar58._8_4_;
          auVar18._12_4_ = auVar58._8_4_;
          auVar70 = pshuflw(auVar85,auVar18,0xe8);
          auVar49._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar49._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar49._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar49._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar77._4_4_ = auVar49._4_4_;
          auVar77._0_4_ = auVar49._4_4_;
          auVar77._8_4_ = auVar49._12_4_;
          auVar77._12_4_ = auVar49._12_4_;
          auVar65 = pshuflw(auVar49,auVar77,0xe8);
          auVar78._4_4_ = auVar58._4_4_;
          auVar78._0_4_ = auVar58._4_4_;
          auVar78._8_4_ = auVar58._12_4_;
          auVar78._12_4_ = auVar58._12_4_;
          auVar45 = pshuflw(auVar58,auVar78,0xe8);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar45 | auVar65 & auVar70) ^ auVar59;
          auVar45 = packssdw(auVar59,auVar59);
          auVar65 = packsswb(auVar65 & auVar70,auVar45);
          if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar38[-0x23] = 1;
          }
          auVar19._4_4_ = auVar58._0_4_;
          auVar19._0_4_ = auVar58._0_4_;
          auVar19._8_4_ = auVar58._8_4_;
          auVar19._12_4_ = auVar58._8_4_;
          auVar78 = auVar77 & auVar19 | auVar78;
          auVar45 = packssdw(auVar78,auVar78);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar7,auVar45 ^ auVar7);
          auVar65 = packsswb(auVar65,auVar45);
          if ((auVar65._8_2_ >> 8 & 1) != 0) {
            puVar38[-0x1e] = 1;
          }
          auVar65 = (auVar62 | auVar33) ^ auVar30;
          auVar60._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar60._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar60._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar60._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar79._4_4_ = auVar60._0_4_;
          auVar79._0_4_ = auVar60._0_4_;
          auVar79._8_4_ = auVar60._8_4_;
          auVar79._12_4_ = auVar60._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar20._4_4_ = iVar83;
          auVar20._0_4_ = iVar83;
          auVar20._8_4_ = iVar87;
          auVar20._12_4_ = iVar87;
          auVar86._4_4_ = auVar60._4_4_;
          auVar86._0_4_ = auVar60._4_4_;
          auVar86._8_4_ = auVar60._12_4_;
          auVar86._12_4_ = auVar60._12_4_;
          auVar65 = auVar20 & auVar79 | auVar86;
          auVar65 = packssdw(auVar65,auVar65);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar8,auVar65 ^ auVar8);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar38[-0x19] = 1;
          }
          auVar65 = pshufhw(auVar65,auVar79,0x84);
          auVar21._4_4_ = iVar83;
          auVar21._0_4_ = iVar83;
          auVar21._8_4_ = iVar87;
          auVar21._12_4_ = iVar87;
          auVar70 = pshufhw(auVar60,auVar21,0x84);
          auVar45 = pshufhw(auVar65,auVar86,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar45 | auVar70 & auVar65) ^ auVar50;
          auVar65 = packssdw(auVar50,auVar50);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._10_2_ >> 8 & 1) != 0) {
            puVar38[-0x14] = 1;
          }
          auVar65 = (auVar62 | _DAT_002fd330) ^ auVar30;
          auVar61._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar61._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar61._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar61._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar22._4_4_ = auVar61._0_4_;
          auVar22._0_4_ = auVar61._0_4_;
          auVar22._8_4_ = auVar61._8_4_;
          auVar22._12_4_ = auVar61._8_4_;
          auVar70 = pshuflw(auVar86,auVar22,0xe8);
          auVar51._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar51._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar51._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar51._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar80._4_4_ = auVar51._4_4_;
          auVar80._0_4_ = auVar51._4_4_;
          auVar80._8_4_ = auVar51._12_4_;
          auVar80._12_4_ = auVar51._12_4_;
          auVar65 = pshuflw(auVar51,auVar80,0xe8);
          auVar81._4_4_ = auVar61._4_4_;
          auVar81._0_4_ = auVar61._4_4_;
          auVar81._8_4_ = auVar61._12_4_;
          auVar81._12_4_ = auVar61._12_4_;
          auVar45 = pshuflw(auVar61,auVar81,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 & auVar70,(auVar45 | auVar65 & auVar70) ^ auVar9);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar38[-0xf] = 1;
          }
          auVar23._4_4_ = auVar61._0_4_;
          auVar23._0_4_ = auVar61._0_4_;
          auVar23._8_4_ = auVar61._8_4_;
          auVar23._12_4_ = auVar61._8_4_;
          auVar81 = auVar80 & auVar23 | auVar81;
          auVar45 = packssdw(auVar81,auVar81);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65,auVar45 ^ auVar10);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._12_2_ >> 8 & 1) != 0) {
            puVar38[-10] = 1;
          }
          auVar65 = (auVar62 | _DAT_002fd320) ^ auVar30;
          auVar52._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar52._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar52._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar52._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar82._4_4_ = auVar52._0_4_;
          auVar82._0_4_ = auVar52._0_4_;
          auVar82._8_4_ = auVar52._8_4_;
          auVar82._12_4_ = auVar52._8_4_;
          auVar63._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar63._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar66._4_4_ = auVar52._4_4_;
          auVar66._0_4_ = auVar52._4_4_;
          auVar66._8_4_ = auVar52._12_4_;
          auVar66._12_4_ = auVar52._12_4_;
          auVar45 = auVar63 & auVar82 | auVar66;
          auVar65 = packssdw(auVar52,auVar45);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar11,auVar65 ^ auVar11);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar38[-5] = 1;
          }
          auVar65 = pshufhw(auVar65,auVar82,0x84);
          in_XMM2 = pshufhw(auVar45,auVar63,0x84);
          in_XMM2 = in_XMM2 & auVar65;
          auVar65 = pshufhw(auVar65,auVar66,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar65 | in_XMM2) ^ auVar53;
          auVar65 = packssdw(auVar53,auVar53);
          in_XMM1 = packsswb(auVar65,auVar65);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar38 = 1;
          }
          uVar41 = uVar41 + 0x10;
          puVar38 = puVar38 + 0x50;
        } while ((lVar39 + 0x10U & 0xfffffffffffffff0) != uVar41);
      }
    }
    if (iVar35 != 0) {
      uVar41 = 1;
      do {
        local_50.typ = VM_INT;
        local_50.val.obj = (vm_obj_id_t)uVar41;
        vm_val_t::ll_index(rhs,&local_40,&local_50);
        vmb_put_dh((char *)(*(long *)((long)&pCVar1[uVar37].ptr_ + 8) + (long)(int)uVar42 * 5 + 2),
                   &local_40);
        uVar41 = uVar41 + 1;
        uVar42 = (ulong)((int)uVar42 + 1);
      } while (iVar35 + 1 != uVar41);
    }
  }
  result->typ = VM_OBJ;
  (result->val).obj = vVar36;
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjList::add_to_list(VMG_ vm_val_t *result,
                             vm_obj_id_t self, const char *lstval,
                             const vm_val_t *rhs)
{
    int lhs_cnt, rhs_cnt, alo_cnt;
    vm_obj_id_t obj;
    CVmObjList *objptr;

    /* push self and the other list for protection against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(rhs);

    /* get the number of elements in the left-hand ('self') side */
    lhs_cnt = vmb_get_len(lstval);

    /* get the number of elements the right-hand side concatenates */
    rhs_cnt = (rhs->is_listlike(vmg0_) ? rhs->ll_length(vmg0_) : -1);

    /* if it's not a list, allocate on element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* allocate a new object to hold the new list */
    obj = create(vmg_ FALSE, lhs_cnt + alo_cnt);
    objptr = (CVmObjList *)vm_objp(vmg_ obj);

    /* copy the first list into the new object's list buffer */
    objptr->cons_copy_elements(0, lstval);

    /* add the value or its contents */
    if (rhs_cnt < 0)
    {
        /* single value - add it as-is */
        objptr->cons_set_element(lhs_cnt, rhs);
    }
    else
    {
        /* 
         *   clear the rest of the list, in case gc runs while retrieving
         *   elements from the rhs 
         */
        objptr->cons_clear(lhs_cnt, lhs_cnt + alo_cnt - 1);

        /* add each element from the right-hand side */
        for (int i = 1 ; i <= rhs_cnt ; ++i)
        {
            /* retrieve this element of the rhs */
            vm_val_t val;
            rhs->ll_index(vmg_ &val, i);
                
            /* store the element in the new list */
            objptr->cons_set_element(lhs_cnt + i - 1, &val);
        }
    }

    /* set the result to the new list */
    result->set_obj(obj);

    /* discard the GC protection items */
    G_stk->discard(2);
}